

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O3

Result __thiscall wabt::WastParser::ParseModuleFieldList(WastParser *this,Module *module)

{
  ModuleFieldType MVar1;
  Errors *errors;
  TokenType TVar2;
  TokenType TVar3;
  Result RVar4;
  Enum EVar5;
  bool bVar6;
  Func *func;
  _func_int **pp_Var7;
  FuncDeclaration *decl;
  ModuleField *field;
  ModuleField *pMVar8;
  ResolveFuncTypesExprVisitorDelegate delegate;
  Delegate local_98;
  Module *local_90;
  Errors *local_88;
  ExprVisitor local_80;
  
  TVar2 = Peek(this,0);
  TVar3 = Peek(this,1);
  while (((TVar2 == Lpar && (TVar3 < I8X16)) && ((0x150011ad400U >> ((ulong)TVar3 & 0x3f) & 1) != 0)
         )) {
    RVar4 = ParseModuleField(this,module);
    if ((RVar4.enum_ == Error) &&
       (RVar4 = Synchronize(this,anon_unknown_1::IsModuleField), RVar4.enum_ == Error))
    goto LAB_00161ba4;
    TVar2 = Peek(this,0);
    TVar3 = Peek(this,1);
  }
  RVar4 = ResolveNamesModule(module,this->errors_);
  if (RVar4.enum_ == Error) {
LAB_00161ba4:
    EVar5 = Error;
  }
  else {
    pMVar8 = (module->fields).first_;
    if (pMVar8 != (ModuleField *)0x0) {
      errors = this->errors_;
      bVar6 = false;
      do {
        MVar1 = pMVar8->type_;
        if (MVar1 == Event) {
          decl = (FuncDeclaration *)&pMVar8[1].loc.filename.size_;
LAB_00161c19:
          func = (Func *)0x0;
LAB_00161c1c:
          anon_unknown_1::ResolveFuncTypeWithEmptySignature(module,decl);
          anon_unknown_1::ResolveImplicitlyDefinedFunctionType(&pMVar8->loc,module,decl);
          RVar4 = anon_unknown_1::CheckFuncTypeVarMatchesExplicit(&pMVar8->loc,module,decl,errors);
          bVar6 = RVar4.enum_ == Error || bVar6;
          if (func != (Func *)0x0) {
            local_98._vptr_Delegate = (_func_int **)&PTR__Delegate_001bbbe8;
            local_90 = module;
            local_88 = errors;
            ExprVisitor::ExprVisitor(&local_80,&local_98);
            RVar4 = ExprVisitor::VisitFunc(&local_80,func);
            if (local_80.expr_iter_stack_.
                super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
                ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_80.expr_iter_stack_.
                              super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
                              ._M_impl.super__Vector_impl_data._M_start);
            }
            if (local_80.expr_stack_.super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>
                ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_80.expr_stack_.
                              super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>.
                              _M_impl.super__Vector_impl_data._M_start);
            }
            if (local_80.state_stack_.
                super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>
                ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_80.state_stack_.
                              super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>
                              ._M_impl.super__Vector_impl_data._M_start);
            }
            bVar6 = bVar6 || RVar4.enum_ == Error;
          }
        }
        else {
          if (MVar1 == Import) {
            pp_Var7 = pMVar8[1]._vptr_ModuleField;
            if (pp_Var7 == (_func_int **)0x0 || *(int *)(pp_Var7 + 9) != 0) {
              if (*(int *)(pp_Var7 + 9) != 4) {
                pp_Var7 = (_func_int **)0x0;
              }
              if (pp_Var7 == (_func_int **)0x0) goto LAB_00161cd3;
            }
            decl = (FuncDeclaration *)(pp_Var7 + 0xe);
            goto LAB_00161c19;
          }
          if (MVar1 == Func) {
            func = (Func *)(pMVar8 + 1);
            decl = (FuncDeclaration *)&pMVar8[1].loc.filename.size_;
            goto LAB_00161c1c;
          }
        }
LAB_00161cd3:
        pMVar8 = (pMVar8->super_intrusive_list_base<wabt::ModuleField>).next_;
      } while (pMVar8 != (ModuleField *)0x0);
      if (bVar6) {
        return (Result)Error;
      }
    }
    EVar5 = Ok;
  }
  return (Result)EVar5;
}

Assistant:

Result WastParser::ParseModuleFieldList(Module* module) {
  WABT_TRACE(ParseModuleFieldList);
  while (IsModuleField(PeekPair())) {
    if (Failed(ParseModuleField(module))) {
      CHECK_RESULT(Synchronize(IsModuleField));
    }
  }
  CHECK_RESULT(ResolveNamesModule(module, errors_));
  CHECK_RESULT(ResolveFuncTypes(module, errors_));
  return Result::Ok;
}